

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitfromevents.cpp
# Opt level: O2

void __thiscall
YAML::EmitFromEvents::OnMapStart
          (EmitFromEvents *this,Mark *param_1,string *tag,anchor_t anchor,value style)

{
  EMITTER_MANIP value;
  value local_24;
  
  BeginNode(this);
  EmitProps(this,tag,anchor);
  if (style == Block) {
    value = Block;
  }
  else {
    if (style != Flow) goto LAB_0069a87c;
    value = Flow;
  }
  Emitter::SetLocalValue(this->m_emitter,value);
LAB_0069a87c:
  Emitter::RestoreGlobalModifiedSettings(this->m_emitter);
  Emitter::SetLocalValue(this->m_emitter,BeginMap);
  std::
  deque<YAML::EmitFromEvents::State::value,_std::allocator<YAML::EmitFromEvents::State::value>_>::
  emplace_back<YAML::EmitFromEvents::State::value>(&(this->m_stateStack).c,&local_24);
  return;
}

Assistant:

void EmitFromEvents::OnMapStart(const Mark&, const std::string& tag,
                                anchor_t anchor, EmitterStyle::value style) {
  BeginNode();
  EmitProps(tag, anchor);
  switch (style) {
    case EmitterStyle::Block:
      m_emitter << Block;
      break;
    case EmitterStyle::Flow:
      m_emitter << Flow;
      break;
    default:
      break;
  }
  // Restore the global settings to eliminate the override from node style
  m_emitter.RestoreGlobalModifiedSettings();
  m_emitter << BeginMap;
  m_stateStack.push(State::WaitingForKey);
}